

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O0

void expr_list(t_expr *x,t_symbol *s,int argc,t_atom *argv)

{
  int local_2c;
  int i;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_expr *x_local;
  
  argv_local._4_4_ = argc;
  if (100 < argc) {
    argv_local._4_4_ = 100;
  }
  for (local_2c = 0; local_2c < argv_local._4_4_; local_2c = local_2c + 1) {
    if (argv[local_2c].a_type == A_FLOAT) {
      if (x->exp_var[local_2c].ex_type == 0xc) {
        x->exp_var[local_2c].ex_cont.v_flt = argv[local_2c].a_w.w_float;
      }
      else if (x->exp_var[local_2c].ex_type == 0xb) {
        x->exp_var[local_2c].ex_cont.v_int = (long)argv[local_2c].a_w.w_float;
      }
      else if (x->exp_var[local_2c].ex_type != 0) {
        pd_error(x,"expr: type mismatch");
      }
    }
    else if (argv[local_2c].a_type == A_SYMBOL) {
      if (x->exp_var[local_2c].ex_type == 0xd) {
        *(word *)(x->exp_var + local_2c) = argv[local_2c].a_w;
      }
      else if (x->exp_var[local_2c].ex_type != 0) {
        pd_error(x,"expr: type mismatch");
      }
    }
  }
  expr_bang(x);
  return;
}

Assistant:

static void
expr_list(t_expr *x, t_symbol *s, int argc, const fts_atom_t *argv)
{
        int i;

        if (argc > MAX_VARS) argc = MAX_VARS;

        for (i = 0; i < argc; i++)
        {
                if (argv[i].a_type == A_FLOAT)
                {
                        if (x->exp_var[i].ex_type == ET_FI)
                                x->exp_var[i].ex_flt = argv[i].a_w.w_float;
                        else if (x->exp_var[i].ex_type == ET_II)
                                x->exp_var[i].ex_int = argv[i].a_w.w_float;
                        else if (x->exp_var[i].ex_type)
                            pd_error(x, "expr: type mismatch");
                }
                else if (argv[i].a_type == A_SYMBOL)
                {
                        if (x->exp_var[i].ex_type == ET_SI)
                                x->exp_var[i].ex_ptr = (char *)argv[i].a_w.w_symbol;
                        else if (x->exp_var[i].ex_type)
                            pd_error(x, "expr: type mismatch");
                }
        }
        expr_bang(x);
}